

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O1

void __thiscall
vkt::Draw::PipelineCreateInfo::DynamicState::DynamicState
          (DynamicState *this,
          vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_> *_dynamicStates)

{
  iterator __position;
  pointer pVVar1;
  undefined8 in_RAX;
  size_t i;
  long lVar2;
  undefined8 uStack_28;
  
  (this->m_dynamicStates).
  super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_dynamicStates).
  super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_dynamicStates).
  super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_VkPipelineDynamicStateCreateInfo).sType =
       VK_STRUCTURE_TYPE_PIPELINE_DYNAMIC_STATE_CREATE_INFO;
  (this->super_VkPipelineDynamicStateCreateInfo).pNext = (void *)0x0;
  (this->super_VkPipelineDynamicStateCreateInfo).flags = 0;
  if ((_dynamicStates->super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>).
      _M_impl.super__Vector_impl_data._M_finish ==
      (_dynamicStates->super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>).
      _M_impl.super__Vector_impl_data._M_start) {
    lVar2 = 0;
    uStack_28 = in_RAX;
    do {
      uStack_28 = CONCAT44((VkDynamicState)lVar2,(undefined4)uStack_28);
      __position._M_current =
           (this->m_dynamicStates).
           super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_dynamicStates).
          super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>::
        _M_realloc_insert<vk::VkDynamicState>
                  (&this->m_dynamicStates,__position,(VkDynamicState *)((long)&uStack_28 + 4));
      }
      else {
        *__position._M_current = (VkDynamicState)lVar2;
        (this->m_dynamicStates).
        super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 9);
  }
  else {
    std::vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>::operator=
              (&this->m_dynamicStates,_dynamicStates);
  }
  pVVar1 = (this->m_dynamicStates).
           super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->super_VkPipelineDynamicStateCreateInfo).dynamicStateCount =
       (deUint32)
       ((ulong)((long)(this->m_dynamicStates).
                      super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)pVVar1) >> 2);
  (this->super_VkPipelineDynamicStateCreateInfo).pDynamicStates = pVVar1;
  return;
}

Assistant:

PipelineCreateInfo::DynamicState::DynamicState (const std::vector<vk::VkDynamicState>& _dynamicStates)
{
	sType	= vk::VK_STRUCTURE_TYPE_PIPELINE_DYNAMIC_STATE_CREATE_INFO;
	pNext	= DE_NULL;
	flags	= 0;

	if (!_dynamicStates.size())
	{
		for (size_t i = 0; i < vk::VK_DYNAMIC_STATE_LAST; ++i)
		{
			m_dynamicStates.push_back(static_cast<vk::VkDynamicState>(i));
		}
	}
	else
		m_dynamicStates = _dynamicStates;

	dynamicStateCount = static_cast<deUint32>(m_dynamicStates.size());
	pDynamicStates = &m_dynamicStates[0];
}